

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cfg_analysis.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::StructuredCFGAnalysis::NestingDepth(StructuredCFGAnalysis *this,uint32_t bb_id)

{
  undefined4 local_1c;
  undefined4 local_18;
  uint32_t merge_block_id;
  uint32_t result;
  uint32_t bb_id_local;
  StructuredCFGAnalysis *this_local;
  
  local_18 = 0;
  for (local_1c = MergeBlock(this,bb_id); local_1c != 0; local_1c = MergeBlock(this,local_1c)) {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

uint32_t StructuredCFGAnalysis::NestingDepth(uint32_t bb_id) {
  uint32_t result = 0;

  // Find the merge block of the current merge construct as long as the block is
  // inside a merge construct, exiting one for each iteration.
  for (uint32_t merge_block_id = MergeBlock(bb_id); merge_block_id != 0;
       merge_block_id = MergeBlock(merge_block_id)) {
    result++;
  }

  return result;
}